

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_simulation_helpers.hpp
# Opt level: O0

void LDPC4QKD::CodeSimulationHelpers::noise_bitstring_inplace<bool>
               (mt19937_64 *rng,vector<bool,_std::allocator<bool>_> *src,double err_prob)

{
  ulong uVar1;
  result_type_conflict rVar2;
  bool bVar3;
  size_type sVar4;
  reference local_70;
  reference local_60;
  reference local_50;
  reference local_40;
  ulong local_30;
  size_t i;
  bernoulli_distribution distribution;
  double err_prob_local;
  vector<bool,_std::allocator<bool>_> *src_local;
  mt19937_64 *rng_local;
  
  distribution._M_param._M_p = (param_type)(param_type)err_prob;
  std::bernoulli_distribution::bernoulli_distribution((bernoulli_distribution *)&i,err_prob);
  local_30 = 0;
  while( true ) {
    uVar1 = local_30;
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(src);
    if (sVar4 <= uVar1) break;
    rVar2 = std::bernoulli_distribution::operator()((bernoulli_distribution *)&i,rng);
    if (rVar2) {
      local_40 = std::vector<bool,_std::allocator<bool>_>::operator[](src,local_30);
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_40);
      local_50 = std::vector<bool,_std::allocator<bool>_>::operator[](src,local_30);
      std::_Bit_reference::operator=(&local_50,(bool)((bVar3 ^ 0xffU) & 1));
    }
    else {
      local_60 = std::vector<bool,_std::allocator<bool>_>::operator[](src,local_30);
      local_70 = std::vector<bool,_std::allocator<bool>_>::operator[](src,local_30);
      std::_Bit_reference::operator=(&local_70,&local_60);
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void noise_bitstring_inplace(std::mt19937_64 &rng, std::vector<T> &src, double err_prob) {
        std::bernoulli_distribution distribution(err_prob);

        for (std::size_t i = 0; i < src.size(); i++) {
            if (distribution(rng)) {
                src[i] = !src[i];
            } else {
                src[i] = src[i];
            }
        }
    }